

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
::~FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
           *this)

{
  ~FunctionMockerBase(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }